

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

BasicBlock * __thiscall spvtools::opt::CFG::SplitLoopHeader(CFG *this,BasicBlock *bb)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  CFG *this_00;
  UnderlyingIterator this_01;
  IRContext *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  uint32_t uVar5;
  Analysis preserved_analyses;
  Instruction *pIVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  pointer this_03;
  mapped_type *pmVar7;
  Function *pFVar8;
  LoopDescriptor *this_04;
  Loop *pLVar9;
  Operand *local_370;
  Loop *parent_loop;
  Loop *loop;
  LoopDescriptor *loop_desc;
  const_iterator local_2f0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2e8;
  uint32_t local_2dc;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2d8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2d0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2c8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  latch_pos;
  mapped_type *block_preds;
  Instruction *local_2a8;
  Instruction *latch_branch;
  uint32_t local_298;
  function<void_(unsigned_int_*)> local_290;
  uint32_t local_26c;
  uint32_t local_268;
  uint32_t local_264;
  iterator local_260;
  undefined8 local_258;
  SmallVector<unsigned_int,_2UL> local_250;
  Operand local_228;
  undefined1 local_1f8 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1d8
  ;
  undefined1 local_1d0 [8];
  InstructionBuilder branch_builder;
  function<void_(spvtools::opt::Instruction_*)> local_190;
  uint32_t local_16c;
  iterator local_168;
  undefined8 local_160;
  SmallVector<unsigned_int,_2UL> local_158;
  anon_class_16_2_72caedee local_130;
  function<void_(spvtools::opt::Instruction_*)> local_120;
  iterator local_100;
  CFG *local_f8;
  BasicBlock *new_header;
  iterator iter;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_d8;
  uint32_t local_cc;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b8;
  iterator local_b0;
  undefined1 local_a0 [8];
  iterator latch_block_iter;
  BasicBlock *latch_block;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pred;
  DebugScope local_70;
  iterator local_68;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> local_58;
  undefined1 local_48 [8];
  iterator header_it;
  IRContext *pIStack_30;
  uint32_t new_header_id;
  IRContext *context;
  Function *fn;
  BasicBlock *bb_local;
  CFG *this_local;
  
  fn = (Function *)bb;
  bb_local = (BasicBlock *)this;
  pIVar6 = BasicBlock::GetLoopMergeInst(bb);
  if (pIVar6 == (Instruction *)0x0) {
    __assert_fail("bb->GetLoopMergeInst() && \"Expecting bb to be the header of a loop.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                  ,0xc1,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
  }
  context = (IRContext *)BasicBlock::GetParent((BasicBlock *)fn);
  pIStack_30 = Module::context(this->module_);
  header_it.iterator_._M_current._4_4_ = IRContext::TakeNextId(pIStack_30);
  if (header_it.iterator_._M_current._4_4_ == 0) {
    this_local = (CFG *)0x0;
  }
  else {
    local_58 = opt::Function::begin((Function *)context);
    local_68 = opt::Function::end((Function *)context);
    local_70 = (DebugScope)fn;
    _local_48 = std::
                find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,spvtools::opt::CFG::SplitLoopHeader(spvtools::opt::BasicBlock*)::__3>
                          (local_58,local_68,(anon_class_8_1_3fcf64fe_for__M_pred)fn);
    _pred = opt::Function::end((Function *)context);
    bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_48,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&pred);
    if (!bVar2) {
      __assert_fail("header_it != fn->end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                    ,0xd1,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
    }
    uVar3 = BasicBlock::id((BasicBlock *)fn);
    this_02 = preds(this,uVar3);
    latch_block_iter.iterator_._M_current =
         (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
         0x0;
    local_a0 = local_48;
    latch_block_iter.container_ = header_it.container_;
    while( true ) {
      local_b0 = opt::Function::end((Function *)context);
      bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_a0,&local_b0)
      ;
      if (!bVar2) break;
      local_c0._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_02);
      local_c8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_02);
      this_03 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                          ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_a0);
      local_cc = BasicBlock::id(this_03);
      local_b8 = std::
                 find<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                           (local_c0,local_c8,&local_cc);
      local_d8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_02);
      bVar2 = __gnu_cxx::operator!=(&local_b8,&local_d8);
      if (bVar2) break;
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_a0);
    }
    _iter = opt::Function::end((Function *)context);
    bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_a0,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&iter);
    if (!bVar2) {
      __assert_fail("latch_block_iter != fn->end() && \"Could not find the latch.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                    ,0xdf,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
    }
    latch_block_iter.iterator_._M_current =
         (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
         UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                   ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_a0);
    RemoveSuccessorEdges(this,(BasicBlock *)fn);
    BasicBlock::begin((BasicBlock *)&new_header);
    while( true ) {
      pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)&new_header);
      OVar4 = opt::Instruction::opcode(pIVar6);
      pFVar8 = fn;
      pIVar1 = pIStack_30;
      uVar3 = header_it.iterator_._M_current._4_4_;
      if (OVar4 != OpPhi) break;
      InstructionList::iterator::operator++((iterator *)&new_header);
    }
    InstructionList::iterator::iterator(&local_100,(iterator *)&new_header);
    local_f8 = (CFG *)BasicBlock::SplitBasicBlock((BasicBlock *)pFVar8,pIVar1,uVar3,&local_100);
    pIVar1 = pIStack_30;
    pIVar6 = BasicBlock::GetLabelInst((BasicBlock *)local_f8);
    IRContext::AnalyzeDefUse(pIVar1,pIVar6);
    RegisterBlock(this,(BasicBlock *)local_f8);
    pIVar1 = pIStack_30;
    pIVar6 = BasicBlock::GetLabelInst((BasicBlock *)local_f8);
    IRContext::set_instr_block(pIVar1,pIVar6,(BasicBlock *)local_f8);
    this_00 = local_f8;
    local_130.new_header = (BasicBlock *)local_f8;
    local_130.context = pIStack_30;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::CFG::SplitLoopHeader(spvtools::opt::BasicBlock*)::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_120,&local_130);
    BasicBlock::ForEachInst((BasicBlock *)this_00,&local_120,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_120);
    if ((Function *)latch_block_iter.iterator_._M_current == fn) {
      uVar3 = BasicBlock::ContinueBlockId((BasicBlock *)local_f8);
      uVar5 = BasicBlock::id((BasicBlock *)fn);
      if (uVar3 == uVar5) {
        pIVar6 = BasicBlock::GetLoopMergeInst((BasicBlock *)local_f8);
        local_16c = header_it.iterator_._M_current._4_4_;
        local_168 = &local_16c;
        local_160 = 1;
        init_list_00._M_len = 1;
        init_list_00._M_array = local_168;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_158,init_list_00);
        opt::Instruction::SetInOperand(pIVar6,1,&local_158);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_158);
      }
      latch_block_iter.iterator_._M_current =
           (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *
           )local_f8;
    }
    pFVar8 = fn;
    branch_builder._24_8_ = latch_block_iter.iterator_._M_current;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::CFG::SplitLoopHeader(spvtools::opt::BasicBlock*)::__1,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_190,
               (anon_class_32_4_e4e09c90 *)&branch_builder.preserved_analyses_);
    BasicBlock::ForEachPhiInst((BasicBlock *)pFVar8,&local_190,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_190);
    pFVar8 = fn;
    pIVar1 = pIStack_30;
    preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
    InstructionBuilder::InstructionBuilder
              ((InstructionBuilder *)local_1d0,pIVar1,(BasicBlock *)pFVar8,preserved_analyses);
    pFVar8 = fn;
    local_1f8[0x1c] = -7;
    local_1f8[0x1d] = '\0';
    local_1f8[0x1e] = '\0';
    local_1f8[0x1f] = '\0';
    local_1f8[0x18] = '\0';
    local_1f8[0x19] = '\0';
    local_1f8[0x1a] = '\0';
    local_1f8[0x1b] = '\0';
    local_1f8._20_4_ = 0;
    local_264 = BasicBlock::id((BasicBlock *)local_f8);
    local_260 = &local_264;
    local_258 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_260;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_250,init_list);
    Operand::Operand(&local_228,SPV_OPERAND_TYPE_ID,&local_250);
    local_1f8._0_8_ = &local_228;
    local_1f8._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*&,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1d8,&stack0xffffffffffffffd0,(Op *)(local_1f8 + 0x1c),
               (int *)(local_1f8 + 0x18),(int *)(local_1f8 + 0x14),
               (initializer_list<spvtools::opt::Operand> *)local_1f8);
    BasicBlock::AddInstruction((BasicBlock *)pFVar8,&local_1d8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1d8);
    local_370 = (Operand *)local_1f8;
    do {
      local_370 = local_370 + -1;
      Operand::~Operand(local_370);
    } while (local_370 != &local_228);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_250);
    pIVar1 = pIStack_30;
    pIVar6 = BasicBlock::terminator((BasicBlock *)fn);
    IRContext::AnalyzeUses(pIVar1,pIVar6);
    pIVar1 = pIStack_30;
    pIVar6 = BasicBlock::terminator((BasicBlock *)fn);
    IRContext::set_instr_block(pIVar1,pIVar6,(BasicBlock *)fn);
    local_268 = BasicBlock::id((BasicBlock *)local_f8);
    pmVar7 = std::
             unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&this->label2preds_,&local_268);
    local_26c = BasicBlock::id((BasicBlock *)fn);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar7,&local_26c);
    this_01 = latch_block_iter.iterator_;
    latch_branch = (Instruction *)fn;
    local_298 = header_it.iterator_._M_current._4_4_;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::CFG::SplitLoopHeader(spvtools::opt::BasicBlock*)::__2,void>
              ((function<void(unsigned_int*)> *)&local_290,(anon_class_16_2_d0346ef9 *)&latch_branch
              );
    BasicBlock::ForEachSuccessorLabel((BasicBlock *)this_01._M_current,&local_290);
    std::function<void_(unsigned_int_*)>::~function(&local_290);
    local_2a8 = BasicBlock::terminator((BasicBlock *)latch_block_iter.iterator_._M_current);
    IRContext::AnalyzeUses(pIStack_30,local_2a8);
    block_preds._4_4_ = BasicBlock::id((BasicBlock *)local_f8);
    pmVar7 = std::
             unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&this->label2preds_,(key_type *)((long)&block_preds + 4));
    block_preds._0_4_ = BasicBlock::id((BasicBlock *)latch_block_iter.iterator_._M_current);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (pmVar7,(value_type *)&block_preds);
    latch_pos._M_current._4_4_ = BasicBlock::id((BasicBlock *)fn);
    pmVar7 = std::
             unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&this->label2preds_,(key_type *)((long)&latch_pos._M_current + 4));
    local_2d0._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pmVar7);
    local_2d8._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pmVar7);
    local_2dc = BasicBlock::id((BasicBlock *)latch_block_iter.iterator_._M_current);
    local_2c8 = std::
                find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                          (local_2d0,local_2d8,&local_2dc);
    local_2e8._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pmVar7);
    bVar2 = __gnu_cxx::operator!=(&local_2c8,&local_2e8);
    if (!bVar2) {
      __assert_fail("latch_pos != block_preds.end() && \"The cfg was invalid.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                    ,0x147,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_2f0,&local_2c8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase(pmVar7,local_2f0);
    bVar2 = IRContext::AreAnalysesValid(pIStack_30,kAnalysisLoopAnalysis);
    pIVar1 = pIStack_30;
    if (bVar2) {
      pFVar8 = BasicBlock::GetParent((BasicBlock *)fn);
      this_04 = IRContext::GetLoopDescriptor(pIVar1,pFVar8);
      uVar3 = BasicBlock::id((BasicBlock *)fn);
      pLVar9 = LoopDescriptor::operator[](this_04,uVar3);
      Loop::AddBasicBlock(pLVar9,header_it.iterator_._M_current._4_4_);
      Loop::SetHeaderBlock(pLVar9,(BasicBlock *)local_f8);
      LoopDescriptor::SetBasicBlockToLoop(this_04,header_it.iterator_._M_current._4_4_,pLVar9);
      uVar3 = BasicBlock::id((BasicBlock *)fn);
      Loop::RemoveBasicBlock(pLVar9,uVar3);
      Loop::SetPreHeaderBlock(pLVar9,(BasicBlock *)fn);
      pLVar9 = Loop::GetParent(pLVar9);
      if (pLVar9 == (Loop *)0x0) {
        uVar3 = BasicBlock::id((BasicBlock *)fn);
        LoopDescriptor::SetBasicBlockToLoop(this_04,uVar3,(Loop *)0x0);
      }
      else {
        uVar3 = BasicBlock::id((BasicBlock *)fn);
        Loop::AddBasicBlock(pLVar9,uVar3);
        uVar3 = BasicBlock::id((BasicBlock *)fn);
        LoopDescriptor::SetBasicBlockToLoop(this_04,uVar3,pLVar9);
      }
    }
    this_local = local_f8;
  }
  return (BasicBlock *)this_local;
}

Assistant:

BasicBlock* CFG::SplitLoopHeader(BasicBlock* bb) {
  assert(bb->GetLoopMergeInst() && "Expecting bb to be the header of a loop.");

  Function* fn = bb->GetParent();
  IRContext* context = module_->context();

  // Get the new header id up front.  If we are out of ids, then we cannot split
  // the loop.
  uint32_t new_header_id = context->TakeNextId();
  if (new_header_id == 0) {
    return nullptr;
  }

  // Find the insertion point for the new bb.
  Function::iterator header_it = std::find_if(
      fn->begin(), fn->end(),
      [bb](BasicBlock& block_in_func) { return &block_in_func == bb; });
  assert(header_it != fn->end());

  const std::vector<uint32_t>& pred = preds(bb->id());
  // Find the back edge
  BasicBlock* latch_block = nullptr;
  Function::iterator latch_block_iter = header_it;
  for (; latch_block_iter != fn->end(); ++latch_block_iter) {
    // If blocks are in the proper order, then the only branch that appears
    // after the header is the latch.
    if (std::find(pred.begin(), pred.end(), latch_block_iter->id()) !=
        pred.end()) {
      break;
    }
  }
  assert(latch_block_iter != fn->end() && "Could not find the latch.");
  latch_block = &*latch_block_iter;

  RemoveSuccessorEdges(bb);

  // Create the new header bb basic bb.
  // Leave the phi instructions behind.
  auto iter = bb->begin();
  while (iter->opcode() == spv::Op::OpPhi) {
    ++iter;
  }

  BasicBlock* new_header = bb->SplitBasicBlock(context, new_header_id, iter);
  context->AnalyzeDefUse(new_header->GetLabelInst());

  // Update cfg
  RegisterBlock(new_header);

  // Update bb mappings.
  context->set_instr_block(new_header->GetLabelInst(), new_header);
  new_header->ForEachInst([new_header, context](Instruction* inst) {
    context->set_instr_block(inst, new_header);
  });

  // If |bb| was the latch block, the branch back to the header is not in
  // |new_header|.
  if (latch_block == bb) {
    if (new_header->ContinueBlockId() == bb->id()) {
      new_header->GetLoopMergeInst()->SetInOperand(1, {new_header_id});
    }
    latch_block = new_header;
  }

  // Adjust the OpPhi instructions as needed.
  bb->ForEachPhiInst([latch_block, bb, new_header, context](Instruction* phi) {
    std::vector<uint32_t> preheader_phi_ops;
    std::vector<Operand> header_phi_ops;

    // Identify where the original inputs to original OpPhi belong: header or
    // preheader.
    for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
      uint32_t def_id = phi->GetSingleWordInOperand(i);
      uint32_t branch_id = phi->GetSingleWordInOperand(i + 1);
      if (branch_id == latch_block->id()) {
        header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {def_id}});
        header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {branch_id}});
      } else {
        preheader_phi_ops.push_back(def_id);
        preheader_phi_ops.push_back(branch_id);
      }
    }

    // Create a phi instruction if and only if the preheader_phi_ops has more
    // than one pair.
    if (preheader_phi_ops.size() > 2) {
      InstructionBuilder builder(
          context, &*bb->begin(),
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

      Instruction* new_phi = builder.AddPhi(phi->type_id(), preheader_phi_ops);

      // Add the OpPhi to the header bb.
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {new_phi->result_id()}});
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {bb->id()}});
    } else {
      // An OpPhi with a single entry is just a copy.  In this case use the same
      // instruction in the new header.
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {preheader_phi_ops[0]}});
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {bb->id()}});
    }

    phi->RemoveFromList();
    std::unique_ptr<Instruction> phi_owner(phi);
    phi->SetInOperands(std::move(header_phi_ops));
    new_header->begin()->InsertBefore(std::move(phi_owner));
    context->set_instr_block(phi, new_header);
    context->AnalyzeUses(phi);
  });

  // Add a branch to the new header.
  InstructionBuilder branch_builder(
      context, bb,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  bb->AddInstruction(
      MakeUnique<Instruction>(context, spv::Op::OpBranch, 0, 0,
                              std::initializer_list<Operand>{
                                  {SPV_OPERAND_TYPE_ID, {new_header->id()}}}));
  context->AnalyzeUses(bb->terminator());
  context->set_instr_block(bb->terminator(), bb);
  label2preds_[new_header->id()].push_back(bb->id());

  // Update the latch to branch to the new header.
  latch_block->ForEachSuccessorLabel([bb, new_header_id](uint32_t* id) {
    if (*id == bb->id()) {
      *id = new_header_id;
    }
  });
  Instruction* latch_branch = latch_block->terminator();
  context->AnalyzeUses(latch_branch);
  label2preds_[new_header->id()].push_back(latch_block->id());

  auto& block_preds = label2preds_[bb->id()];
  auto latch_pos =
      std::find(block_preds.begin(), block_preds.end(), latch_block->id());
  assert(latch_pos != block_preds.end() && "The cfg was invalid.");
  block_preds.erase(latch_pos);

  // Update the loop descriptors
  if (context->AreAnalysesValid(IRContext::kAnalysisLoopAnalysis)) {
    LoopDescriptor* loop_desc = context->GetLoopDescriptor(bb->GetParent());
    Loop* loop = (*loop_desc)[bb->id()];

    loop->AddBasicBlock(new_header_id);
    loop->SetHeaderBlock(new_header);
    loop_desc->SetBasicBlockToLoop(new_header_id, loop);

    loop->RemoveBasicBlock(bb->id());
    loop->SetPreHeaderBlock(bb);

    Loop* parent_loop = loop->GetParent();
    if (parent_loop != nullptr) {
      parent_loop->AddBasicBlock(bb->id());
      loop_desc->SetBasicBlockToLoop(bb->id(), parent_loop);
    } else {
      loop_desc->SetBasicBlockToLoop(bb->id(), nullptr);
    }
  }
  return new_header;
}